

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl.cxx
# Opt level: O2

void Fl::watch_widget_pointer(Fl_Widget **w)

{
  Fl_Widget ***pppFVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  
  iVar2 = num_widget_watch;
  lVar5 = (long)num_widget_watch;
  uVar4 = 0;
  uVar3 = 0;
  if (0 < num_widget_watch) {
    uVar4 = (ulong)(uint)num_widget_watch;
  }
  do {
    if (uVar4 == uVar3) {
      if (num_widget_watch == max_widget_watch) {
        max_widget_watch = num_widget_watch + 8;
        widget_watch = (Fl_Widget ***)realloc(widget_watch,lVar5 * 8 + 0x40);
      }
      num_widget_watch = iVar2 + 1;
      widget_watch[lVar5] = w;
      return;
    }
    pppFVar1 = widget_watch + uVar3;
    uVar3 = uVar3 + 1;
  } while (*pppFVar1 != w);
  return;
}

Assistant:

void Fl::watch_widget_pointer(Fl_Widget *&w)
{
  Fl_Widget **wp = &w;
  int i;
  for (i=0; i<num_widget_watch; ++i) {
    if (widget_watch[i]==wp) return;
  }
  if (num_widget_watch==max_widget_watch) {
    max_widget_watch += 8;
    widget_watch = (Fl_Widget***)realloc(widget_watch, sizeof(Fl_Widget**)*max_widget_watch);
  }
  widget_watch[num_widget_watch++] = wp;
#ifdef DEBUG_WATCH
  printf ("\nwatch_widget_pointer:   (%d/%d) %8p => %8p\n",
    num_widget_watch,num_widget_watch,wp,*wp);
  fflush(stdout);
#endif // DEBUG_WATCH
}